

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodePrivate * __thiscall
QDomNamedNodeMapPrivate::namedItemNS
          (QDomNamedNodeMapPrivate *this,QString *nsURI,QString *localName)

{
  bool bVar1;
  QDomNodePrivate *pQVar2;
  long in_FS_OFFSET;
  const_iterator local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QString,_QDomNodePrivate_*>::constBegin(&local_48,&this->map);
  while (local_48.e != (Chain **)0x0) {
    pQVar2 = (*local_48.e)->value;
    if ((pQVar2->prefix).d.ptr != (char16_t *)0x0) {
      bVar1 = comparesEqual(&pQVar2->namespaceURI,nsURI);
      if (bVar1) {
        bVar1 = comparesEqual(&pQVar2->name,localName);
        if (bVar1) goto LAB_0010f925;
      }
    }
    QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator++(&local_48);
  }
  pQVar2 = (QDomNodePrivate *)0x0;
LAB_0010f925:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomNamedNodeMapPrivate::namedItemNS(const QString& nsURI, const QString& localName) const
{
    auto it = map.constBegin();
    QDomNodePrivate *n;
    for (; it != map.constEnd(); ++it) {
        n = it.value();
        if (!n->prefix.isNull()) {
            // node has a namespace
            if (n->namespaceURI == nsURI && n->name == localName)
                return n;
        }
    }
    return nullptr;
}